

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileDescriptorProto::MergePartialFromCodedStream
          (FileDescriptorProto *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  Rep *pRVar4;
  uint8 *puVar5;
  Arena *this_01;
  char *data;
  bool bVar6;
  short extraout_AX;
  short extraout_AX_00;
  short sVar7;
  uint32 uVar8;
  uint extraout_EAX;
  SourceCodeInfo *this_02;
  ulong extraout_RAX;
  FileOptions *this_03;
  ulong extraout_RAX_00;
  Type *this_04;
  Type *this_05;
  Type *this_06;
  Type *this_07;
  pair<int,_int> pVar9;
  string *value;
  Type *pTVar10;
  RepeatedField<int> *pRVar11;
  UnknownFieldSet *unknown_fields;
  char cVar12;
  uint tag;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int local_a0;
  int local_9c;
  
  this_00 = &this->dependency_;
  do {
    pbVar2 = input->buffer_;
    uVar8 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar8 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_005a1957;
      input->buffer_ = pbVar2 + 1;
      uVar13 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_005a1957:
      uVar8 = io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar13 = 0;
      if (uVar8 - 1 < 0x7f) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar8 | uVar13;
    }
    tag = (uint)uVar13;
    if ((uVar13 & 0x100000000) == 0) goto switchD_005a19e0_default;
    cVar12 = (char)uVar13;
    switch((uint)(uVar13 >> 3) & 0x1fffffff) {
    case 1:
      MergePartialFromCodedStream();
      sVar7 = extraout_AX;
      goto LAB_005a1e8c;
    case 2:
      MergePartialFromCodedStream();
      sVar7 = extraout_AX_00;
LAB_005a1e8c:
      if (sVar7 == 0) break;
      iVar15 = 6;
      if (sVar7 != 1) goto LAB_005a19b5;
      goto LAB_005a19b8;
    case 3:
      if (cVar12 != '\x1a') break;
      pRVar4 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar4 == (Rep *)0x0) {
LAB_005a1d73:
        internal::RepeatedPtrFieldBase::Reserve
                  (&this_00->super_RepeatedPtrFieldBase,
                   (this->dependency_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_005a1d83:
        pRVar4 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
        pRVar4->allocated_size = pRVar4->allocated_size + 1;
        this_01 = (this->dependency_).super_RepeatedPtrFieldBase.arena_;
        if (this_01 == (Arena *)0x0) {
          value = (string *)operator_new(0x20);
          (value->_M_dataplus)._M_p = (pointer)&value->field_2;
          value->_M_string_length = 0;
          (value->field_2)._M_local_buf[0] = '\0';
        }
        else {
          value = (string *)
                  Arena::AllocateAligned(this_01,(type_info *)&std::__cxx11::string::typeinfo,0x20);
          (value->_M_dataplus)._M_p = (pointer)&value->field_2;
          value->_M_string_length = 0;
          (value->field_2)._M_local_buf[0] = '\0';
          Arena::AddListNode(this_01,value,internal::arena_destruct_object<std::__cxx11::string>);
        }
        pRVar4 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
        iVar15 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
        (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar15 + 1;
        pRVar4->elements[iVar15] = value;
      }
      else {
        iVar15 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar4->allocated_size <= iVar15) {
          if (pRVar4->allocated_size == (this->dependency_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_005a1d73;
          goto LAB_005a1d83;
        }
        (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar15 + 1;
        value = (string *)pRVar4->elements[iVar15];
      }
      bVar6 = internal::WireFormatLite::ReadBytes(input,value);
      if (!bVar6) goto LAB_005a1ed7;
      pTVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&this_00->super_RepeatedPtrFieldBase,
                           (this->dependency_).super_RepeatedPtrFieldBase.current_size_ + -1);
      data = (pTVar10->_M_dataplus)._M_p;
      pTVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&this_00->super_RepeatedPtrFieldBase,
                           (this->dependency_).super_RepeatedPtrFieldBase.current_size_ + -1);
      internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar10->_M_string_length,PARSE,
                 "google.protobuf.FileDescriptorProto.dependency");
      goto LAB_005a19b5;
    case 4:
      if (cVar12 != '\"') break;
      this_06 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                          (&(this->message_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (iVar14 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
        input->buffer_ = puVar5 + 1;
        bVar6 = true;
      }
      else {
        iVar14 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar6 = -1 < iVar14;
      }
      iVar15 = 6;
      if (bVar6) {
        pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar14);
        if (-1 < (long)pVar9) {
          bVar6 = DescriptorProto::MergePartialFromCodedStream(this_06,input);
LAB_005a1d42:
          iVar15 = 6;
          if (bVar6 != false) {
            bVar6 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar9.first);
            if (bVar6) goto LAB_005a19b5;
            goto LAB_005a19b8;
          }
        }
LAB_005a1d63:
        iVar15 = 6;
      }
      goto LAB_005a19b8;
    case 5:
      if (cVar12 == '*') {
        this_05 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                            (&(this->enum_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar14 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
          input->buffer_ = puVar5 + 1;
          bVar6 = true;
        }
        else {
          iVar14 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar6 = -1 < iVar14;
        }
        iVar15 = 6;
        if (bVar6) {
          pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar14);
          if (-1 < (long)pVar9) {
            bVar6 = EnumDescriptorProto::MergePartialFromCodedStream(this_05,input);
            goto LAB_005a1d42;
          }
          goto LAB_005a1d63;
        }
        goto LAB_005a19b8;
      }
      break;
    case 6:
      if (cVar12 == '2') {
        this_04 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                            (&(this->service_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar14 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
          input->buffer_ = puVar5 + 1;
          bVar6 = true;
        }
        else {
          iVar14 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar6 = -1 < iVar14;
        }
        iVar15 = 6;
        if (bVar6) {
          pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar14);
          if (-1 < (long)pVar9) {
            bVar6 = ServiceDescriptorProto::MergePartialFromCodedStream(this_04,input);
            goto LAB_005a1d42;
          }
          goto LAB_005a1d63;
        }
        goto LAB_005a19b8;
      }
      break;
    case 7:
      if (cVar12 == ':') {
        this_07 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                            (&(this->extension_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar14 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
          input->buffer_ = puVar5 + 1;
          bVar6 = true;
        }
        else {
          iVar14 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar6 = -1 < iVar14;
        }
        iVar15 = 6;
        if (bVar6) {
          pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar14);
          if (-1 < (long)pVar9) {
            bVar6 = FieldDescriptorProto::MergePartialFromCodedStream(this_07,input);
            goto LAB_005a1d42;
          }
          goto LAB_005a1d63;
        }
        goto LAB_005a19b8;
      }
      break;
    case 8:
      if (cVar12 == 'B') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        if (this->options_ == (FileOptions *)0x0) {
          this_03 = (FileOptions *)operator_new(0xb0);
          FileOptions::FileOptions(this_03);
          this->options_ = this_03;
        }
        MergePartialFromCodedStream();
        iVar15 = local_9c;
        if ((extraout_RAX_00 & 1) != 0) goto LAB_005a19b8;
        goto LAB_005a19b5;
      }
      break;
    case 9:
      if (cVar12 == 'J') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        if (this->source_code_info_ == (SourceCodeInfo *)0x0) {
          this_02 = (SourceCodeInfo *)operator_new(0x30);
          SourceCodeInfo::SourceCodeInfo(this_02);
          this->source_code_info_ = this_02;
        }
        MergePartialFromCodedStream();
        iVar15 = local_a0;
        if ((extraout_RAX & 1) == 0) goto LAB_005a19b5;
        goto LAB_005a19b8;
      }
      break;
    case 10:
      pRVar11 = &this->public_dependency_;
      if (cVar12 == 'R') {
LAB_005a1c47:
        bVar6 = internal::WireFormatLite::
                ReadPackedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,pRVar11);
      }
      else {
        if ((tag & 0xff) != 0x50) break;
        uVar8 = 0x50;
LAB_005a1bac:
        bVar6 = internal::WireFormatLite::
                ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (1,uVar8,input,pRVar11);
      }
      goto LAB_005a19ad;
    case 0xb:
      pRVar11 = &this->weak_dependency_;
      if (cVar12 == 'Z') goto LAB_005a1c47;
      if ((tag & 0xff) == 0x58) {
        uVar8 = 0x58;
        goto LAB_005a1bac;
      }
      break;
    case 0xc:
      MergePartialFromCodedStream();
      if ((short)extraout_EAX != 1) {
        if ((extraout_EAX & 0xffff) != 0) goto LAB_005a19b5;
        break;
      }
      goto LAB_005a1ed7;
    }
switchD_005a19e0_default:
    iVar15 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar3 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        unknown_fields =
             internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      bVar6 = internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_005a19ad:
      if (bVar6 == false) {
LAB_005a1ed7:
        iVar15 = 6;
      }
      else {
LAB_005a19b5:
        iVar15 = 0;
      }
    }
LAB_005a19b8:
    if (iVar15 != 0) {
      return iVar15 != 6;
    }
  } while( true );
}

Assistant:

bool FileDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FileDescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string package = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->package().data(), this->package().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.package");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string dependency = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_dependency()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->dependency(this->dependency_size() - 1).data(),
            this->dependency(this->dependency_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.dependency");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto message_type = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_message_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.ServiceDescriptorProto service = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_service()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FileOptions options = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_source_code_info()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 public_dependency = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 80u, input, this->mutable_public_dependency())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(82u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_public_dependency())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 weak_dependency = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 88u, input, this->mutable_weak_dependency())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(90u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_weak_dependency())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string syntax = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(98u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_syntax()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->syntax().data(), this->syntax().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.syntax");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FileDescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FileDescriptorProto)
  return false;
#undef DO_
}